

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::php::anon_unknown_0::PhpGeneratorTest_RequiredFieldError_Test::
PhpGeneratorTest_RequiredFieldError_Test(PhpGeneratorTest_RequiredFieldError_Test *this)

{
  PhpGeneratorTest_RequiredFieldError_Test *this_local;
  
  PhpGeneratorTest::PhpGeneratorTest(&this->super_PhpGeneratorTest);
  (this->super_PhpGeneratorTest).super_CommandLineInterfaceTester.super_Test._vptr_Test =
       (_func_int **)&PTR__PhpGeneratorTest_RequiredFieldError_Test_02a124c0;
  return;
}

Assistant:

TEST_F(PhpGeneratorTest, RequiredFieldError) {
  CreateTempFile("foo.proto",
                 R"schema(
    syntax = "proto2";
    message FooBar {
      required int32 foo_message = 1;
    })schema");

  RunProtoc(
      "protocol_compiler --proto_path=$tmpdir --php_out=$tmpdir foo.proto");

  ExpectErrorSubstring(
      "Can't generate PHP code for required field FooBar.foo_message");
}